

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

BIGNUM * bn_expand2(BIGNUM *b,int words)

{
  unsigned_long *pnt;
  unsigned_long *a;
  int in_stack_00000024;
  BIGNUM *in_stack_00000028;
  size_t in_stack_ffffffffffffffd8;
  BIGNUM *local_8;
  
  local_8 = (BIGNUM *)b;
  if (b->dmax < words) {
    pnt = bn_expand_internal(in_stack_00000028,in_stack_00000024);
    if (pnt == (unsigned_long *)0x0) {
      local_8 = (BIGNUM *)0x0;
    }
    else {
      if (b->d != (unsigned_long *)0x0) {
        CRYPTO_memzero(pnt,in_stack_ffffffffffffffd8);
        bn_free_d((BIGNUM *)0x115210);
      }
      b->d = pnt;
      b->dmax = words;
    }
  }
  return local_8;
}

Assistant:

BIGNUM *bn_expand2(BIGNUM *b, int words)
{
    bn_check_top(b);

    if (words > b->dmax) {
        BN_ULONG *a = bn_expand_internal(b, words);
        if (!a)
            return NULL;
        if (b->d) {
            CRYPTO_memzero(b->d, b->dmax * sizeof(b->d[0]));
            bn_free_d(b);
        }
        b->d = a;
        b->dmax = words;
    }

    bn_check_top(b);
    return b;
}